

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excp_helper.c
# Opt level: O2

_Bool x86_cpu_tlb_fill_x86_64
                (CPUState *cs,vaddr addr,int size,MMUAccessType access_type,int mmu_idx,_Bool probe,
                uintptr_t retaddr)

{
  byte bVar1;
  uint32_t uVar2;
  uint uVar3;
  TranslationBlock *pTVar4;
  uint64_t uVar5;
  ulong uVar6;
  hwaddr hVar7;
  uint32_t uVar8;
  uint uVar9;
  uint64_t uVar10;
  int exception_index;
  undefined7 in_register_00000089;
  uint64_t uVar11;
  TranslationBlock *pTVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  int local_68;
  uint local_60;
  int local_5c;
  ulong local_58;
  TranslationBlock *local_50;
  hwaddr local_48;
  ulong local_40;
  undefined4 local_34;
  
  cs[1].tb_jmp_cache[0x39e] = (TranslationBlock *)retaddr;
  uVar9 = *(uint *)(cs[1].tb_jmp_cache + 0x101);
  if ((uVar9 >> 0x13 & 1) == 0) {
    local_58 = (ulong)*(int *)(cs[1].tb_jmp_cache + 0x125);
  }
  else {
    local_58 = 0xffffffffffffffff;
  }
  if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x903) & 0x80) == 0) {
    uVar6 = addr & 0xffffffff;
    if ((uVar9 >> 0xe & 1) != 0) {
      uVar6 = addr;
    }
    local_60 = 7;
    uVar13 = 1 << ((byte)access_type & 0x1f);
    uVar9 = 0x1000;
    goto LAB_004c9336;
  }
  local_40 = (ulong)(access_type & MMU_DATA_STORE);
  local_34 = (undefined4)CONCAT71(in_register_00000089,probe);
  local_5c = mmu_idx;
  local_50 = (TranslationBlock *)addr;
  if (((ulong)cs[1].tb_jmp_cache[0x124] & 0x20) == 0) {
    local_68 = 0;
    local_48 = get_hphys(cs,((ulong)cs[1].tb_jmp_cache[0x123] & 0xfffffffffffff000) +
                            (addr >> 0x16 & 0x3ff) * 4 & local_58,MMU_DATA_STORE,(int *)0x0);
    uVar2 = x86_ldl_phys_x86_64(cs,local_48);
    if ((uVar2 & 1) != 0) {
      if (((char)uVar2 < '\0') && (((ulong)cs[1].tb_jmp_cache[0x124] & 0x10) != 0)) {
        uVar11 = (ulong)(uVar2 & 0x1fe000) << 0x13 | (ulong)uVar2;
        uVar14 = (ulong)uVar2 | 0x8000000000000000;
        uVar9 = 0x400000;
        uVar6 = 0x200000;
LAB_004c91a5:
        local_68 = 9;
        if ((uVar11 & uVar6) == 0) {
          if ((local_5c == 1) && ((uVar14 & 4) == 0)) {
            local_68 = 1;
          }
          else {
            local_60 = 0;
            if ((local_5c == 0) && (uVar15 = 0, (uVar14 & 4) != 0)) {
LAB_004c9216:
              if ((long)uVar14 < 0) {
                if (local_5c != 1) {
LAB_004c9220:
                  if (((*(byte *)((long)cs[1].tb_jmp_cache + 0x922) & 0x10) != 0) &&
                     ((uVar14 & 4) != 0)) goto LAB_004c923a;
                }
LAB_004c9231:
                uVar15 = uVar15 | 4;
                local_60 = uVar15;
              }
            }
            else {
              local_60 = 1;
              if ((uVar14 & 2) != 0) {
LAB_004c920a:
                local_60 = 3;
                uVar15 = 3;
                goto LAB_004c9216;
              }
              if (local_5c != 1) {
                if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x902) & 1) == 0) goto LAB_004c920a;
                uVar15 = 1;
                if (-1 < (long)uVar14) goto LAB_004c923a;
                goto LAB_004c9220;
              }
              uVar15 = 1;
              if ((long)uVar14 < 0) goto LAB_004c9231;
            }
LAB_004c923a:
            if (((((*(byte *)((long)cs[1].tb_jmp_cache + 0x922) & 0x40) != 0) &&
                 ((*(byte *)((long)cs[1].tb_jmp_cache + 0x809) & 0x40) != 0)) && ((uVar14 & 4) != 0)
                ) && (uVar13 = *(uint *)(cs[1].tb_jmp_cache + 0x37e), uVar13 != 0)) {
              if ((uVar13 >> ((uint)(uVar11 >> 0x3a) & 0x1e) & 1) == 0) {
                uVar3 = 7;
                if (((uVar13 >> ((byte)(uVar11 >> 0x3a) & 0x1e) & 2) != 0) &&
                   ((local_5c == 1 || ((*(byte *)((long)cs[1].tb_jmp_cache + 0x902) & 1) != 0)))) {
                  uVar3 = 5;
                }
              }
              else {
                uVar3 = 4;
              }
              uVar15 = uVar15 & uVar3;
              local_60 = uVar15;
              if ((uVar3 >> (access_type & 0x1f) & 1) == 0) {
                if (access_type == MMU_INST_FETCH) {
                  __assert_fail("is_write1 != 2",
                                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/excp_helper.c"
                                ,0x25c,"int handle_mmu_fault(CPUState *, vaddr, int, int, int)");
                }
                local_68 = 0x21;
                goto LAB_004c93f4;
              }
            }
            local_68 = 1;
            uVar13 = 1 << ((byte)access_type & 0x1f);
            if ((uVar15 >> (access_type & 0x1f) & 1) != 0) {
              bVar1 = (uVar11 & 0x40) == 0 & (byte)local_40;
              uVar6 = uVar11;
              if (((byte)((uVar11 & 0xffffffff) >> 5) & 7 & (bVar1 ^ 1)) == 0) {
                uVar14 = (ulong)bVar1 << 6;
                uVar6 = uVar14 | uVar11 | 0x20;
                x86_stl_phys_notdirty_x86_64(cs,local_48,(uint)uVar14 | (uint)uVar11 | 0x20);
              }
              addr = (vaddr)local_50;
              mmu_idx = local_5c;
              if ((uVar6 & 0x40) == 0) {
                if ((int)local_40 != 0) {
                  __assert_fail("!is_write",
                                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/excp_helper.c"
                                ,0x273,"int handle_mmu_fault(CPUState *, vaddr, int, int, int)");
                }
                local_60 = uVar15 & 0xfffffffd;
              }
LAB_004c9336:
              hVar7 = get_hphys(cs,(ulong)((uint)addr & uVar9 - 1) +
                                   (local_58 & 0xffffffffff000 & (long)(int)-uVar9 & uVar6),
                                access_type,(int *)&local_60);
              if ((local_60 & uVar13) == 0) {
                __assert_fail("prot & (1 << is_write1)",
                              "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/excp_helper.c"
                              ,0x284,"int handle_mmu_fault(CPUState *, vaddr, int, int, int)");
              }
              tlb_set_page_with_attrs_x86_64
                        (cs,addr & 0xfffffffffffff000,hVar7 & 0xfffffffffffff000,
                         (MemTxAttrs)(*(uint *)(cs[1].tb_jmp_cache + 0x101) >> 0x12 & 2),local_60,
                         mmu_idx,(ulong)uVar9);
              return true;
            }
          }
        }
      }
      else {
        uVar8 = uVar2;
        if ((uVar2 & 0x20) == 0) {
          uVar8 = uVar2 | 0x20;
          x86_stl_phys_notdirty_x86_64(cs,local_48,uVar8);
        }
        local_68 = 0;
        local_48 = get_hphys(cs,(ulong)((uint)local_58 &
                                       ((uint)((ulong)local_50 >> 10) & 0xffc | uVar8 & 0xfffff000))
                             ,MMU_DATA_STORE,(int *)0x0);
        uVar8 = x86_ldl_phys_x86_64(cs,local_48);
        uVar11 = (uint64_t)uVar8;
        if ((uVar8 & 1) != 0) {
          uVar14 = (ulong)(uVar2 & uVar8) | 0x8000000000000000;
          uVar9 = 0x1000;
          uVar6 = 0;
          goto LAB_004c9199;
        }
      }
    }
  }
  else {
    uVar6 = ((ulong)(*(byte *)((long)cs[1].tb_jmp_cache + 0x989) >> 3) << 0x3f) + 0x800fff0000000000
    ;
    if ((uVar9 >> 0xe & 1) == 0) {
      local_68 = 0;
      hVar7 = get_hphys(cs,((ulong)cs[1].tb_jmp_cache[0x123] & 0xffffffffffffffe0) +
                           (addr >> 0x1e & 3) * 8 & local_58,MMU_DATA_STORE,(int *)0x0);
      uVar11 = x86_ldq_phys_x86_64(cs,hVar7);
      if ((uVar11 & 1) == 0) goto LAB_004c93f4;
      if (uVar11 >> 0x28 == 0) {
        uVar6 = uVar6 | 0x7ff0000000000000;
        uVar14 = 0x8000000000000006;
LAB_004c907f:
        local_68 = 0;
        local_48 = get_hphys(cs,((ulong)((uint)((ulong)local_50 >> 0x12) & 0xff8) |
                                uVar11 & 0xffffffffff000) & local_58,MMU_DATA_STORE,(int *)0x0);
        uVar11 = x86_ldq_phys_x86_64(cs,local_48);
        if ((uVar11 & 1) == 0) goto LAB_004c93f4;
        if ((uVar11 & uVar6) == 0) {
          uVar14 = (uVar11 ^ 0x8000000000000000) & uVar14;
          uVar9 = 0x200000;
          if (-1 < (char)uVar11) {
            if ((uVar11 & 0x20) == 0) {
              x86_stl_phys_notdirty_x86_64(cs,local_48,(uint)uVar11 | 0x20);
            }
            local_68 = 0;
            local_48 = get_hphys(cs,((ulong)((uint)((ulong)local_50 >> 9) & 0xff8) |
                                    uVar11 & 0xffffffffff000) & local_58,MMU_DATA_STORE,(int *)0x0);
            uVar11 = x86_ldq_phys_x86_64(cs,local_48);
            if ((uVar11 & 1) == 0) goto LAB_004c93f4;
            if ((uVar11 & uVar6) != 0) goto LAB_004c93e7;
            uVar14 = uVar14 & (uVar11 ^ 0x8000000000000000);
            uVar9 = 0x1000;
          }
LAB_004c9199:
          uVar6 = uVar9 - 1 & 0x7fffe000 | uVar6;
          goto LAB_004c91a5;
        }
      }
      goto LAB_004c93e7;
    }
    uVar9 = (uint)cs[1].tb_jmp_cache[0x124];
    if (((long)addr >> (((uVar9 >> 0xc & 1) != 0) * '\t' + 0x2fU & 0x3f)) - 1U < 0xfffffffffffffffe)
    {
      exception_index = 0xd;
      uVar9 = 0;
      goto LAB_004c9467;
    }
    pTVar12 = cs[1].tb_jmp_cache[0x123];
    if ((uVar9 >> 0xc & 1) == 0) {
      uVar14 = 0x8000000000000006;
LAB_004c8f4f:
      local_68 = 0;
      hVar7 = get_hphys(cs,((ulong)((uint)((ulong)local_50 >> 0x24) & 0xff8) |
                           (ulong)pTVar12 & 0xffffffffff000) & local_58,MMU_DATA_STORE,(int *)0x0);
      uVar11 = x86_ldq_phys_x86_64(cs,hVar7);
      pTVar12 = local_50;
      if ((uVar11 & 1) != 0) {
        if ((uVar11 & (uVar6 | 0x80)) == 0) {
          uVar10 = uVar11;
          if ((uVar11 & 0x20) == 0) {
            uVar10 = uVar11 | 0x20;
            x86_stl_phys_notdirty_x86_64(cs,hVar7,(uint)uVar11 | 0x20);
          }
          local_68 = 0;
          local_48 = get_hphys(cs,((ulong)((uint)((ulong)pTVar12 >> 0x1b) & 0xff8) |
                                  uVar10 & 0xffffffffff000) & local_58,MMU_DATA_STORE,(int *)0x0);
          uVar5 = x86_ldq_phys_x86_64(cs,local_48);
          if ((uVar5 & 1) == 0) goto LAB_004c93f4;
          if ((uVar5 & uVar6) == 0) {
            uVar11 = uVar5;
            if ((uVar5 & 0x20) == 0) {
              uVar11 = uVar5 | 0x20;
              x86_stl_phys_notdirty_x86_64(cs,local_48,(uint)uVar5 | 0x20);
            }
            uVar14 = (uVar10 ^ 0x8000000000000000) & uVar14 & (uVar5 ^ 0x8000000000000000);
            uVar9 = 0x40000000;
            if ((char)uVar11 < '\0') goto LAB_004c9199;
            goto LAB_004c907f;
          }
        }
LAB_004c93e7:
        local_68 = 9;
      }
    }
    else {
      local_68 = 0;
      hVar7 = get_hphys(cs,((ulong)((uint)(addr >> 0x2d) & 0xff8) |
                           (ulong)pTVar12 & 0xfffffffffffff000) & local_58,MMU_DATA_STORE,(int *)0x0
                       );
      pTVar4 = (TranslationBlock *)x86_ldq_phys_x86_64(cs,hVar7);
      if (((ulong)pTVar4 & 1) != 0) {
        if (((ulong)pTVar4 & (uVar6 | 0x80)) == 0) {
          pTVar12 = pTVar4;
          if (((ulong)pTVar4 & 0x20) == 0) {
            pTVar12 = (TranslationBlock *)((ulong)pTVar4 | 0x20);
            x86_stl_phys_notdirty_x86_64(cs,hVar7,(uint)pTVar4 | 0x20);
          }
          uVar14 = (ulong)pTVar12 ^ 0x8000000000000000;
          goto LAB_004c8f4f;
        }
        local_68 = 9;
      }
    }
  }
LAB_004c93f4:
  uVar9 = local_68 + 4 + (int)local_40 * 2;
  if (local_5c != 1) {
    uVar9 = local_68 + (int)local_40 * 2;
  }
  if (access_type == MMU_INST_FETCH) {
    uVar13 = uVar9;
    if (((uint)cs[1].tb_jmp_cache[0x124] >> 0x14 & 1) != 0) {
      uVar13 = uVar9 | 0x10;
    }
    uVar15 = uVar9 | 0x10;
    if (((ulong)cs[1].tb_jmp_cache[0x124] & 0x20) == 0) {
      uVar15 = uVar13;
    }
    uVar9 = uVar13;
    if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x989) & 8) != 0) {
      uVar9 = uVar15;
    }
  }
  if ((*(byte *)((long)cs[1].tb_jmp_cache + 0x1cd9) & 0x40) == 0) {
    cs[1].tb_jmp_cache[0x122] = local_50;
  }
  else {
    x86_stq_phys_x86_64(cs,(hwaddr)(cs[1].tb_jmp_cache[0x397]->jmp_list_next + 1),(uint64_t)local_50
                       );
  }
  exception_index = 0xe;
LAB_004c9467:
  *(uint *)(cs[1].tb_jmp_cache + 0x388) = uVar9;
  cs->exception_index = exception_index;
  if ((char)local_34 == '\0') {
    raise_exception_err_ra_x86_64
              ((CPUX86State *)(cs[1].tb_jmp_cache + 0xeb),exception_index,uVar9,retaddr);
  }
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/excp_helper.c"
             ,0x2ad,"!probe");
}

Assistant:

bool x86_cpu_tlb_fill(CPUState *cs, vaddr addr, int size,
                      MMUAccessType access_type, int mmu_idx,
                      bool probe, uintptr_t retaddr)
{
    X86CPU *cpu = X86_CPU(cs);
    CPUX86State *env = &cpu->env;

    env->retaddr = retaddr;
    if (handle_mmu_fault(cs, addr, size, access_type, mmu_idx)) {
        /* FIXME: On error in get_hphys we have already jumped out.  */
        g_assert(!probe);
        raise_exception_err_ra(env, cs->exception_index,
                               env->error_code, retaddr);
    }
    return true;
}